

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_2c4;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_log;
  string local_2a8;
  string hgXMLTemplate;
  string hg;
  string range;
  OutputLogger err;
  LogParser out;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).OldRevision,":");
  std::operator+(&range,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&hg,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hgXMLTemplate,
             "<logentry\n   revision=\"{node|short}\">\n  <author>{author|person}</author>\n  <email>{author|email}</email>\n  <date>{date|isodate}</date>\n  <msg>{desc}</msg>\n  <files>{files}</files>\n  <file_adds>{file_adds}</file_adds>\n  <file_dels>{file_dels}</file_dels>\n</logentry>\n"
             ,(allocator<char> *)&out);
  std::__cxx11::string::string((string *)&out,(string *)&hg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_OutputLogger.super_LineParser.Line._M_string_length,"log",
             (allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_cmXMLParser,"--removed",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_cmXMLParser.Parser,"-r",&local_2c2);
  std::__cxx11::string::string((string *)out.Rev.Rev.field_2._M_local_buf,(string *)&range);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)out.Rev.Date.field_2._M_local_buf,"--template",&local_2c3);
  std::__cxx11::string::string
            ((string *)out.Rev.Author.field_2._M_local_buf,(string *)&hgXMLTemplate);
  __l._M_len = 7;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hg_log,__l,&local_2c4);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&out.super_OutputLogger.super_LineParser.super_OutputParser._vptr_OutputParser
               + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  LogParser::LogParser(&out,this,"log-out> ");
  cmProcessTools::OutputParser::Process((OutputParser *)&out,"<?xml version=\"1.0\"?>\n<log>\n");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&hg_log,(OutputParser *)&out,(OutputParser *)&err,&local_2a8
                      ,Auto);
  std::__cxx11::string::~string((string *)&local_2a8);
  cmProcessTools::OutputParser::Process((OutputParser *)&out,"</log>\n");
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  LogParser::~LogParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hg_log);
  std::__cxx11::string::~string((string *)&hgXMLTemplate);
  std::__cxx11::string::~string((string *)&hg);
  std::__cxx11::string::~string((string *)&range);
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  std::string hg = this->CommandLineTool;
  std::string hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  std::vector<std::string> hg_log = { hg,    "log",        "--removed",  "-r",
                                      range, "--template", hgXMLTemplate };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}